

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void absl::lts_20250127::synchronization_internal::MoveToList(Rep *r,Vec<int> *src,Vec<int> *dst)

{
  Node **ppNVar1;
  uint32_t local_44;
  int32_t *piStack_40;
  int32_t w;
  int *v;
  int *__end2;
  int *__begin2;
  Vec<int> *__range2;
  Vec<int> *dst_local;
  Vec<int> *src_local;
  Rep *r_local;
  
  __begin2 = (int *)src;
  __range2 = dst;
  dst_local = src;
  src_local = (Vec<int> *)r;
  __end2 = anon_unknown_0::Vec<int>::begin(src);
  v = anon_unknown_0::Vec<int>::end((Vec<int> *)__begin2);
  for (; __end2 != v; __end2 = __end2 + 1) {
    piStack_40 = __end2;
    local_44 = *__end2;
    ppNVar1 = anon_unknown_0::
              Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[]((Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
                          *)src_local,local_44);
    *piStack_40 = (*ppNVar1)->rank;
    ppNVar1 = anon_unknown_0::
              Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[]((Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
                          *)src_local,local_44);
    (*ppNVar1)->visited = false;
    anon_unknown_0::Vec<int>::push_back(__range2,(int *)&local_44);
  }
  return;
}

Assistant:

static void MoveToList(
    GraphCycles::Rep* r, Vec<int32_t>* src, Vec<int32_t>* dst) {
  for (auto& v : *src) {
    int32_t w = v;
    // Replace v entry with its rank
    v = r->nodes_[static_cast<uint32_t>(w)]->rank;
    // Prepare for future DFS calls
    r->nodes_[static_cast<uint32_t>(w)]->visited = false;
    dst->push_back(w);
  }
}